

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

void __thiscall
basisu::etc1_optimizer::refine_solution(etc1_optimizer *this,uint32_t max_refinement_trials)

{
  undefined8 uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  bool bVar10;
  int iVar11;
  uint8_t uVar12;
  potential_solution *in_RCX;
  undefined7 uVar14;
  uchar *puVar13;
  etc1_optimizer *peVar15;
  int iVar16;
  uint32_t uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar29;
  undefined1 auVar22 [16];
  int iVar26;
  uint uVar27;
  int iVar28;
  int iVar30;
  uint uVar31;
  int iVar32;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar42;
  undefined1 auVar33 [16];
  int iVar43;
  undefined1 auVar41 [16];
  float fVar44;
  undefined1 in_XMM4 [16];
  undefined1 auVar45 [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_74;
  undefined4 local_70;
  undefined1 local_6c;
  potential_solution *local_68;
  potential_solution *local_60;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_40;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  if (max_refinement_trials != 0) {
    uVar3 = this->m_pParams->m_num_src_pixels;
    local_60 = &this->m_best_solution;
    local_58 = (float)uVar3;
    local_68 = &this->m_trial_solution;
    uStack_40 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    auVar45 = pmovzxbd(in_XMM4,0xffffffff);
    uVar17 = 0;
    peVar15 = this;
    fStack_54 = local_58;
    local_48 = local_58;
    while( true ) {
      if ((this->m_best_solution).m_selectors.m_size == 0) {
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,
                      "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]");
      }
      bVar9 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.m_comps[0];
      uVar14 = (undefined7)((ulong)in_RCX >> 8);
      if ((this->m_best_solution).m_coords.m_color4 == true) {
        bVar9 = bVar9 << 4 | bVar9;
        uVar2 = *(ushort *)((long)&(this->m_best_solution).m_coords.m_unscaled_color.field_0 + 1);
        puVar13 = (uchar *)(ulong)uVar2;
        auVar22 = psllw(ZEXT216(uVar2),4);
        uVar21 = auVar22._0_8_ & (ulong)DAT_002775c0 | (ulong)uVar2;
      }
      else {
        bVar9 = bVar9 << 3 | (byte)((CONCAT71(uVar14,bVar9) & 0xffffffff) >> 2) & 0x3f;
        puVar13 = (uchar *)CONCAT71(uVar14,bVar9);
        uVar2 = *(ushort *)((long)&(this->m_best_solution).m_coords.m_unscaled_color.field_0 + 1);
        auVar22 = psllw(ZEXT216(uVar2),3);
        uVar21 = auVar22._0_8_ & (ulong)DAT_00277580 | (ulong)(uVar2 >> 2) & (ulong)DAT_00277590;
      }
      if (uVar3 == 0) {
        iVar11 = 0;
        iVar20 = 0;
        iVar28 = 0;
        iVar30 = 0;
        iVar32 = 0;
      }
      else {
        puVar13 = (this->m_best_solution).m_selectors.m_p;
        bVar5 = (byte)(uVar21 >> 8);
        auVar40._0_15_ = ZEXT415(0);
        auVar40[0xf] = (char)(uVar21 >> 0x38);
        auVar39._14_2_ = auVar40._14_2_;
        auVar39._0_13_ = ZEXT413(0);
        auVar39[0xd] = (char)(uVar21 >> 0x30);
        auVar38._13_3_ = auVar39._13_3_;
        auVar38._0_13_ = ZEXT413(0);
        auVar37._12_4_ = auVar38._12_4_;
        auVar37._0_11_ = ZEXT411(0);
        auVar37[0xb] = (char)(uVar21 >> 0x28);
        auVar36._11_5_ = auVar37._11_5_;
        auVar36._0_11_ = ZEXT411(0);
        auVar35._10_6_ = auVar36._10_6_;
        auVar35._0_9_ = (unkuint9)0;
        auVar35[9] = (char)(uVar21 >> 0x20);
        auVar34._9_7_ = auVar35._9_7_;
        auVar34._0_9_ = (unkuint9)0;
        auVar8._1_8_ = auVar34._8_8_;
        auVar8[0] = (char)(uVar21 >> 0x18);
        auVar8._9_7_ = 0;
        auVar7._1_10_ = SUB1610(auVar8 << 0x38,6);
        auVar7[0] = (char)(uVar21 >> 0x10);
        auVar7._11_5_ = 0;
        auVar22._1_12_ = SUB1612(auVar7 << 0x28,4);
        auVar22[0] = bVar5;
        auVar22._13_3_ = 0;
        auVar33._2_14_ = SUB1614(auVar22 << 0x18,2);
        auVar33[1] = (char)uVar21;
        auVar33[0] = bVar9;
        auVar22 = pmovzxbd(auVar33,auVar33);
        iVar20 = 0;
        iVar28 = 0;
        iVar30 = 0;
        iVar32 = 0;
        peVar15 = (etc1_optimizer *)0x0;
        iVar11 = 0;
        do {
          iVar16 = *(int *)(g_etc1_inten_tables +
                           (ulong)(puVar13 + -0x14)[(long)(peVar15->m_avg_color).m_v] * 4 +
                           (ulong)(this->m_best_solution).m_coords.m_inten_table * 0x10);
          iVar42 = auVar22._8_4_;
          iVar43 = auVar22._12_4_;
          iVar18 = iVar16 + auVar22._0_4_;
          iVar26 = iVar16 + auVar22._4_4_;
          iVar4 = auVar45._0_4_;
          uVar19 = (uint)(iVar4 < iVar18) * iVar4 | (uint)(iVar4 >= iVar18) * iVar18;
          iVar4 = auVar45._4_4_;
          uVar27 = (uint)(iVar4 < iVar26) * iVar4 | (uint)(iVar4 >= iVar26) * iVar26;
          iVar4 = auVar45._8_4_;
          uVar29 = (uint)(iVar4 < iVar42) * iVar4 | (uint)(iVar4 >= iVar42) * iVar42;
          iVar4 = auVar45._12_4_;
          uVar31 = (uint)(iVar4 < iVar43) * iVar4 | (uint)(iVar4 >= iVar43) * iVar43;
          iVar20 = (-1 < (int)uVar19) * uVar19 + (iVar20 - auVar22._0_4_);
          iVar28 = (-1 < (int)uVar27) * uVar27 + (iVar28 - auVar22._4_4_);
          iVar30 = (-1 < (int)uVar29) * uVar29 + (iVar30 - iVar42);
          iVar32 = (-1 < (int)uVar31) * uVar31 + (iVar32 - iVar43);
          iVar16 = iVar16 + (uint)bVar5;
          if (0xfe < iVar16) {
            iVar16 = 0xff;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          iVar11 = (iVar11 - (uint)bVar5) + iVar16;
          peVar15 = (etc1_optimizer *)((long)&peVar15->m_pParams + 1);
        } while (uVar3 != (uint)peVar15);
      }
      auVar41._0_4_ = -(uint)(iVar20 == 0);
      auVar41._4_4_ = -(uint)(iVar28 == 0);
      auVar41._8_4_ = -(uint)(iVar30 == 0);
      auVar41._12_4_ = -(uint)(iVar32 == 0);
      auVar22 = pmovsxdq(auVar41 ^ _DAT_002fd520,auVar41 ^ _DAT_002fd520);
      uVar19 = movmskpd((int)puVar13,auVar22);
      if ((((uVar19 & 1) == 0) && ((byte)((byte)uVar19 >> 1) == 0)) && (iVar11 == 0)) break;
      auVar23._0_4_ = (float)iVar20;
      auVar23._4_4_ = (float)iVar28;
      auVar23._8_4_ = (float)iVar30;
      auVar23._12_4_ = (float)iVar32;
      auVar6._4_4_ = fStack_54;
      auVar6._0_4_ = local_58;
      auVar6._8_4_ = uStack_50;
      auVar6._12_4_ = uStack_4c;
      auVar22 = divps(auVar23,auVar6);
      iVar20 = this->m_limit;
      fVar44 = (float)iVar20;
      uVar1 = *(undefined8 *)(this->m_avg_color).m_v;
      auVar24._0_4_ = fVar44 * ((float)uVar1 - auVar22._0_4_);
      auVar24._4_4_ = fVar44 * ((float)((ulong)uVar1 >> 0x20) - auVar22._4_4_);
      auVar24._8_4_ = (0.0 - auVar22._8_4_) * 0.0;
      auVar24._12_4_ = (0.0 - auVar22._12_4_) * 0.0;
      auVar22 = divps(auVar24,_DAT_00277830);
      auVar25._0_4_ = (int)(auVar22._0_4_ + 0.5);
      auVar25._4_4_ = (int)(auVar22._4_4_ + 0.5);
      auVar25._8_4_ = (int)(auVar22._8_4_ + 0.0);
      auVar25._12_4_ = (int)(auVar22._12_4_ + 0.0);
      iVar28 = auVar25._0_4_;
      if (iVar20 <= auVar25._0_4_) {
        iVar28 = iVar20;
      }
      iVar30 = auVar25._4_4_;
      if (iVar20 <= auVar25._4_4_) {
        iVar30 = iVar20;
      }
      iVar11 = (int)((((this->m_avg_color).m_v[2] - (float)iVar11 / local_48) * fVar44) / 255.0 +
                    0.5);
      auVar22 = pmovsxdq(auVar25,auVar25);
      if (iVar11 < iVar20) {
        iVar20 = iVar11;
      }
      uVar19 = movmskpd((int)peVar15,auVar22);
      uVar12 = '\0';
      local_74.m_comps[0] = (uint8_t)iVar28;
      if ((uVar19 & 1) != 0) {
        local_74.m_comps[0] = uVar12;
      }
      local_74.m_comps[1] = (uint8_t)iVar30;
      if ((uVar19 & 2) != 0) {
        local_74.m_comps[1] = uVar12;
      }
      local_6c = this->m_pParams->m_use_color4;
      local_74.m_comps[2] = (uint8_t)iVar20;
      if (iVar11 < 0) {
        local_74.m_comps[2] = uVar12;
      }
      local_74.m_comps[3] = 0xff;
      local_70 = 0;
      in_RCX = local_60;
      if ((int)(this->m_pParams->super_basis_etc1_pack_params).m_quality < 1) {
        peVar15 = this;
        bVar10 = evaluate_solution_fast
                           (this,(etc1_solution_coordinates *)&local_74.field_1,local_68,local_60);
      }
      else {
        peVar15 = this;
        bVar10 = evaluate_solution_slow
                           (this,(etc1_solution_coordinates *)&local_74.field_1,local_68,local_60);
      }
      auVar45 = pmovzxbd(auVar45,0xffffffff);
      if (bVar10 == false) {
        return;
      }
      uVar17 = uVar17 + 1;
      if (uVar17 == max_refinement_trials) {
        return;
      }
    }
  }
  return;
}

Assistant:

void etc1_optimizer::refine_solution(uint32_t max_refinement_trials)
	{
		// Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
		// Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
		// The goal is:
		// pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
		// Rearranging this:
		// (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
		// (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
		// (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
		// (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
		// (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
		// block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
		// So what this means:
		// optimal_block_color = avg_input - avg_inten_delta
		// So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
		// Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
		// Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

		const uint32_t n = m_pParams->m_num_src_pixels;

		for (uint32_t refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++)
		{
			const uint8_t* pSelectors = &m_best_solution.m_selectors[0];
			const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

			int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
			const color_rgba base_color(m_best_solution.m_coords.get_scaled_color());
			for (uint32_t r = 0; r < n; r++)
			{
				const uint32_t s = *pSelectors++;
				const int yd_temp = pInten_table[s];
				// Compute actual delta being applied to each pixel, taking into account clamping.
				delta_sum_r += clamp<int>(base_color.r + yd_temp, 0, 255) - base_color.r;
				delta_sum_g += clamp<int>(base_color.g + yd_temp, 0, 255) - base_color.g;
				delta_sum_b += clamp<int>(base_color.b + yd_temp, 0, 255) - base_color.b;
			}

			if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
				break;

			const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
			const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
			const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
			const int br1 = clamp<int>(static_cast<int32_t>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
			const int bg1 = clamp<int>(static_cast<int32_t>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
			const int bb1 = clamp<int>(static_cast<int32_t>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
			printf("Refinement trial %u, avg_delta %f %f %f\n", refinement_trial, avg_delta_r_f, avg_delta_g_f, avg_delta_b_f);
#endif

			if (!evaluate_solution(etc1_solution_coordinates(br1, bg1, bb1, 0, m_pParams->m_use_color4), m_trial_solution, &m_best_solution))
				break;

		}  // refinement_trial
	}